

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_EnumerateCallbackResult setSaneCfgEnumCallback(void *_data,char *dir,char *f)

{
  int iVar1;
  char *in_RAX;
  size_t sVar2;
  DirHandle *pDVar3;
  size_t sVar4;
  long *plVar5;
  ErrState *pEVar6;
  PHYSFS_ErrorCode PVar7;
  long *plVar8;
  long lVar9;
  char *__s;
  ulong uVar10;
  void **retval;
  
  plVar8 = (long *)&stack0xffffffffffffffc8;
  uVar10 = *(ulong *)((long)_data + 8);
  sVar2 = strlen(f);
  lVar9 = sVar2 - uVar10;
  if (((uVar10 <= sVar2 && lVar9 != 0) && (f[lVar9 + -1] == '.')) &&
     (iVar1 = PHYSFS_utf8stricmp(in_RAX,(char *)0x108682), iVar1 == 0)) {
    pDVar3 = getRealDirHandle(f);
    if (pDVar3 == (DirHandle *)0x0) {
      __s = (char *)0x0;
    }
    else {
      __s = pDVar3->dirName;
    }
    sVar4 = strlen(__s);
    uVar10 = sVar4 + sVar2 + 2;
    if (uVar10 < 0x100) {
      plVar8 = (long *)(&stack0xffffffffffffffc8 + -(sVar4 + sVar2 + 0x19 & 0xfffffffffffffff0));
      lVar9 = 0;
      plVar5 = plVar8;
    }
    else {
      plVar5 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar4 + sVar2 + 10);
      if (plVar5 == (long *)0x0) {
        *(undefined4 *)((long)_data + 0x14) = 2;
        return PHYSFS_ENUM_OK;
      }
      lVar9 = 1;
    }
    *plVar5 = lVar9;
    plVar8[-1] = 0x108713;
    snprintf((char *)(plVar5 + 1),uVar10,"%s%c%s",__s,0x2f,f);
    iVar1 = *(int *)((long)_data + 0x10);
    plVar8[-1] = 0x108728;
    iVar1 = doMount((PHYSFS_Io *)0x0,(char *)(plVar5 + 1),(char *)0x0,(uint)(iVar1 == 0));
    if (iVar1 == 0) {
      plVar8[-1] = 0x108731;
      pEVar6 = findErrorForCurrentThread();
      PVar7 = PHYSFS_ERR_OK;
      if (pEVar6 != (ErrState *)0x0) {
        PVar7 = pEVar6->code;
      }
      *(PHYSFS_ErrorCode *)((long)_data + 0x14) = PVar7;
    }
    if (*plVar5 != 0) {
      plVar8[-1] = 0x108750;
      (*__PHYSFS_AllocatorHooks.Free)(plVar5);
    }
  }
  return PHYSFS_ENUM_OK;
}

Assistant:

static PHYSFS_EnumerateCallbackResult setSaneCfgEnumCallback(void *_data,
                                                const char *dir, const char *f)
{
    setSaneCfgEnumData *data = (setSaneCfgEnumData *) _data;
    const size_t extlen = data->archiveExtLen;
    const size_t l = strlen(f);
    const char *ext;

    if ((l > extlen) && (f[l - extlen - 1] == '.'))
    {
        ext = f + (l - extlen);
        if (PHYSFS_utf8stricmp(ext, data->archiveExt) == 0)
        {
            const char dirsep = __PHYSFS_platformDirSeparator;
            const char *d = PHYSFS_getRealDir(f);
            const size_t allocsize = strlen(d) + l + 2;
            char *str = (char *) __PHYSFS_smallAlloc(allocsize);
            if (str == NULL)
                data->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
            else
            {
                snprintf(str, allocsize, "%s%c%s", d, dirsep, f);
                if (!PHYSFS_mount(str, NULL, data->archivesFirst == 0))
                    data->errcode = currentErrorCode();
                __PHYSFS_smallFree(str);
            } /* else */
        } /* if */
    } /* if */

    /* !!! FIXME: if we want to abort on errors... */
    /*return (data->errcode != PHYSFS_ERR_OK) ? PHYSFS_ENUM_ERROR : PHYSFS_ENUM_OK;*/

    return PHYSFS_ENUM_OK;  /* keep going */
}